

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O3

int Acb_NtkComputePathsD(Acb_Ntk_t *p,Vec_Int_t *vTfo,int fReverse)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  if ((p->vPathD).nSize < 1) {
    uVar2 = (p->vObjType).nCap;
    if ((p->vPathD).nCap < (int)uVar2) {
      piVar6 = (p->vPathD).pArray;
      if (piVar6 == (int *)0x0) {
        piVar6 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar6 = (int *)realloc(piVar6,(long)(int)uVar2 << 2);
      }
      (p->vPathD).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vPathD).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((p->vPathD).pArray,0,(ulong)uVar2 * 4);
    }
    (p->vPathD).nSize = uVar2;
  }
  uVar2 = vTfo->nSize;
  if (fReverse == 0) {
    if (0 < (int)uVar2) {
      lVar9 = 0;
      do {
        iVar5 = vTfo->pArray[lVar9];
        lVar7 = (long)iVar5;
        if (lVar7 < 1) goto LAB_00384760;
        if ((p->vObjType).nSize <= iVar5) goto LAB_00384741;
        cVar1 = (p->vObjType).pArray[lVar7];
        iVar4 = Acb_ObjSlack(p,iVar5);
        if (cVar1 == '\x03') {
          if ((p->vPathD).nSize <= iVar5) goto LAB_0038479e;
          (p->vPathD).pArray[lVar7] = (uint)(iVar4 == 0);
        }
        else if (iVar4 == 0) {
          Acb_ObjComputePathD(p,iVar5);
        }
        else {
          if ((p->vPathD).nSize <= iVar5) goto LAB_0038479e;
          (p->vPathD).pArray[lVar7] = 0;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < vTfo->nSize);
    }
  }
  else {
    uVar8 = (ulong)uVar2;
    if (0 < (int)uVar2) {
      do {
        if ((long)vTfo->nSize < (long)uVar8) goto LAB_00384722;
        iVar5 = vTfo->pArray[uVar8 - 1];
        lVar9 = (long)iVar5;
        if (lVar9 < 1) {
LAB_00384760:
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                        ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
        }
        if ((p->vObjType).nSize <= iVar5) {
LAB_00384741:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        cVar1 = (p->vObjType).pArray[lVar9];
        iVar4 = Acb_ObjSlack(p,iVar5);
        if (cVar1 == '\x03') {
          if ((p->vPathD).nSize <= iVar5) goto LAB_0038479e;
          (p->vPathD).pArray[lVar9] = (uint)(iVar4 == 0);
        }
        else if (iVar4 == 0) {
          Acb_ObjComputePathD(p,iVar5);
        }
        else {
          if ((p->vPathD).nSize <= iVar5) {
LAB_0038479e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (p->vPathD).pArray[lVar9] = 0;
        }
        bVar3 = 1 < uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar3);
    }
  }
  lVar9 = (long)(p->vCos).nSize;
  if (lVar9 < 1) {
    iVar5 = 0;
  }
  else {
    lVar7 = 0;
    iVar5 = 0;
    do {
      iVar4 = (p->vCos).pArray[lVar7];
      if ((long)iVar4 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x115,"int Acb_ObjPathD(Acb_Ntk_t *, int)");
      }
      if ((p->vPathD).nSize <= iVar4) {
LAB_00384722:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = iVar5 + (p->vPathD).pArray[iVar4];
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  p->nPaths = iVar5;
  return iVar5;
}

Assistant:

int Acb_NtkComputePathsD( Acb_Ntk_t * p, Vec_Int_t * vTfo, int fReverse )
{
    int i, iObj, Path = 0;
    //Vec_IntPrint( vTfo );
    if ( !Acb_NtkHasObjPathD( p ) )
        Acb_NtkCleanObjPathD( p );
    // it is assumed that vTfo contains CI nodes
    //assert( Acb_ObjSlack(p, Vec_IntEntry(vTfo, 0)) );
    if ( fReverse )
    {
        Vec_IntForEachEntryReverse( vTfo, iObj, i )
        {
            if ( Acb_ObjIsCi(p, iObj) )
                Acb_ObjSetPathD( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathD( p, iObj, 0 );
            else
                Acb_ObjComputePathD( p, iObj );
        }
    }
    else
    {
        Vec_IntForEachEntry( vTfo, iObj, i )
        {
            if ( Acb_ObjIsCi(p, iObj) )
                Acb_ObjSetPathD( p, iObj, Acb_ObjSlack(p, iObj) == 0 );
            else if ( Acb_ObjSlack(p, iObj) )
                Acb_ObjSetPathD( p, iObj, 0 );
            else
                Acb_ObjComputePathD( p, iObj );
        }
    }
    Acb_NtkForEachCo( p, iObj, i )
        Path += Acb_ObjPathD(p, iObj);
    p->nPaths = Path;
    return Path;
}